

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O2

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _w;
  uint _h;
  uint _c;
  ulong uVar2;
  ulong uVar3;
  int local_38;
  
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  if (iVar1 == 3) {
    _c = bottom_blob->c;
    Mat::create(top_blob,_w,_h,_c,1,opt->blob_allocator);
    local_38 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      local_38 = 0;
      if ((int)_c < 1) {
        _c = 0;
      }
      for (uVar3 = 0; _c != uVar3; uVar3 = uVar3 + 1) {
        uVar2 = 0;
        if (this->scale_data_size != 1) {
          uVar2 = uVar3;
        }
        quantize((float *)(bottom_blob->cstep * uVar3 * bottom_blob->elemsize +
                          (long)bottom_blob->data),
                 (char *)(top_blob->cstep * uVar3 * top_blob->elemsize + (long)top_blob->data),
                 *(float *)((long)(this->scale_data).data + uVar2 * 4),_h * _w);
      }
    }
  }
  else if (iVar1 == 2) {
    Mat::create(top_blob,_w,_h,1,opt->blob_allocator);
    local_38 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      local_38 = 0;
      if ((int)_h < 1) {
        _h = 0;
      }
      for (uVar3 = 0; _h != uVar3; uVar3 = uVar3 + 1) {
        uVar2 = 0;
        if (this->scale_data_size != 1) {
          uVar2 = uVar3;
        }
        quantize((float *)((long)bottom_blob->w * uVar3 * bottom_blob->elemsize +
                          (long)bottom_blob->data),
                 (char *)((long)top_blob->w * uVar3 * top_blob->elemsize + (long)top_blob->data),
                 *(float *)((long)(this->scale_data).data + uVar2 * 4),_w);
      }
    }
  }
  else {
    if (iVar1 == 1) {
      Mat::create(top_blob,_w,1,opt->blob_allocator);
      if ((char *)top_blob->data == (char *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      quantize((float *)bottom_blob->data,(char *)top_blob->data,*(this->scale_data).data,_w);
    }
    local_38 = 0;
  }
  return local_38;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    if (dims == 1)
    {
        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        // assert scale_data_size == 1

        const float* ptr = bottom_blob;
        signed char* s8ptr = top_blob;

        const float scale = scale_data[0];

        quantize(ptr, s8ptr, scale, w);
    }

    if (dims == 2)
    {
        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_blob.row(i);
            signed char* s8ptr = top_blob.row<signed char>(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

            quantize(ptr, s8ptr, scale, w);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* s8ptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

            quantize(ptr, s8ptr, scale, w * h);
        }
    }

    return 0;
}